

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_BMP_Image.cxx
# Opt level: O2

void __thiscall Fl_BMP_Image::Fl_BMP_Image(Fl_BMP_Image *this,char *bmp)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  byte bVar9;
  unsigned_short uVar10;
  ushort uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  FILE *__stream;
  uchar *puVar21;
  byte bVar22;
  char cVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  long lVar27;
  uchar uVar28;
  ulong uVar29;
  uchar *puVar30;
  uint uVar31;
  bool bVar32;
  bool bVar33;
  uint local_3a4;
  uint local_388;
  uint local_360;
  char local_35c;
  uchar colormap [256] [3];
  
  Fl_RGB_Image::Fl_RGB_Image(&this->super_Fl_RGB_Image,(uchar *)0x0,0,0,3,0);
  (this->super_Fl_RGB_Image).super_Fl_Image._vptr_Fl_Image =
       (_func_int **)&PTR__Fl_RGB_Image_0027ba10;
  __stream = (FILE *)fl_fopen(bmp,"rb");
  if (__stream == (FILE *)0x0) {
    (this->super_Fl_RGB_Image).super_Fl_Image.ld_ = -2;
    return;
  }
  iVar12 = getc(__stream);
  uVar13 = getc(__stream);
  if (((char)iVar12 != 'B') || ((uVar13 & 0xff) != 0x4d)) {
    fclose(__stream);
    (this->super_Fl_RGB_Image).super_Fl_Image.ld_ = -3;
    return;
  }
  uVar13 = 3;
  read_dword((FILE *)__stream);
  read_word((FILE *)__stream);
  read_word((FILE *)__stream);
  uVar14 = read_dword((FILE *)__stream);
  uVar15 = read_dword((FILE *)__stream);
  if ((int)uVar15 < 0x28) {
    uVar10 = read_word((FILE *)__stream);
    (this->super_Fl_RGB_Image).super_Fl_Image.w_ = (uint)uVar10;
    uVar10 = read_word((FILE *)__stream);
    (this->super_Fl_RGB_Image).super_Fl_Image.h_ = (uint)uVar10;
    read_word((FILE *)__stream);
    uVar11 = read_word((FILE *)__stream);
    iVar12 = uVar15 - 0xc;
    uVar31 = 0;
    lVar27 = 1;
    local_360 = 0xffffffff;
  }
  else {
    iVar12 = read_long((FILE *)__stream);
    (this->super_Fl_RGB_Image).super_Fl_Image.w_ = iVar12;
    uVar31 = read_long((FILE *)__stream);
    local_360 = (int)~uVar31 >> 0x1f | 1;
    uVar18 = -uVar31;
    if (0 < (int)uVar31) {
      uVar18 = uVar31;
    }
    (this->super_Fl_RGB_Image).super_Fl_Image.h_ = uVar18;
    read_word((FILE *)__stream);
    uVar11 = read_word((FILE *)__stream);
    local_388 = read_dword((FILE *)__stream);
    uVar18 = read_dword((FILE *)__stream);
    read_long((FILE *)__stream);
    read_long((FILE *)__stream);
    uVar31 = read_dword((FILE *)__stream);
    read_dword((FILE *)__stream);
    iVar12 = uVar15 - 0x28;
    lVar27 = 1;
    if (uVar11 < 8 || local_388 != 0) goto LAB_002023dd;
    iVar16 = (this->super_Fl_RGB_Image).super_Fl_Image.w_;
    local_388 = 0;
    if ((iVar16 <= (int)(0x20 / uVar11)) ||
       (iVar17 = (this->super_Fl_RGB_Image).super_Fl_Image.h_,
       (((iVar16 + 7U >> 3) + 3 & 0xfffffffc) + ((uint)(uVar11 >> 3) * iVar16 + 3 & 0xfffffffc)) *
       iVar17 != uVar18 * 2)) goto LAB_002023dd;
    uVar13 = 4;
    (this->super_Fl_RGB_Image).super_Fl_Image.h_ = iVar17 / 2;
    lVar27 = 0;
  }
  local_388 = 0;
LAB_002023dd:
  for (; 0 < iVar12; iVar12 = iVar12 + -1) {
    getc(__stream);
  }
  if ((((this->super_Fl_RGB_Image).super_Fl_Image.w_ != 0) && (uVar11 != 0)) &&
     ((this->super_Fl_RGB_Image).super_Fl_Image.h_ != 0)) {
    uVar18 = 1 << ((byte)uVar11 & 0x1f);
    if (8 < uVar11) {
      uVar18 = uVar31;
    }
    if (uVar31 != 0) {
      uVar18 = uVar31;
    }
    uVar25 = 0;
    uVar29 = (ulong)uVar18;
    if ((int)uVar18 < 1) {
      uVar29 = uVar25;
    }
    for (; uVar29 * 3 != uVar25; uVar25 = uVar25 + 3) {
      fread(colormap[0] + uVar25,1,3,__stream);
      if (0xc < (int)uVar15) {
        getc(__stream);
      }
    }
    bVar33 = true;
    if (uVar11 == 0x10) {
      uVar15 = read_dword((FILE *)__stream);
      bVar33 = uVar15 != 0xf800;
    }
    if (uVar11 == 0x20) {
      uVar13 = 4;
    }
    (this->super_Fl_RGB_Image).super_Fl_Image.d_ = uVar13;
    uVar15 = uVar13;
    if ((ulong)uVar14 != 0) {
      fseek(__stream,(ulong)uVar14,0);
      uVar15 = (this->super_Fl_RGB_Image).super_Fl_Image.d_;
    }
    iVar12 = (this->super_Fl_RGB_Image).super_Fl_Image.w_;
    uVar14 = (this->super_Fl_RGB_Image).super_Fl_Image.h_;
    uVar29 = (long)(int)uVar15 * (long)(int)uVar14 * (long)iVar12;
    if (uVar29 < Fl_RGB_Image::max_size_ || uVar29 - Fl_RGB_Image::max_size_ == 0) {
      puVar21 = (uchar *)operator_new__((long)(int)(iVar12 * uVar14 * uVar15));
      (this->super_Fl_RGB_Image).array = puVar21;
      (this->super_Fl_RGB_Image).alloc_array = 1;
      uVar15 = (int)local_360 >> 0x1f & uVar14 - 1;
      if ((int)local_360 < 0) {
        uVar14 = 0xffffffff;
      }
      local_3a4 = 0;
      uVar24 = 0;
      uVar31 = 0;
      uVar18 = 0;
      uVar20 = 0;
      do {
        uVar8 = colormap[1][2];
        uVar7 = colormap[1][1];
        uVar6 = colormap[1][0];
        uVar5 = colormap[0][2];
        uVar4 = colormap[0][1];
        uVar3 = colormap[0][0];
        if (uVar15 == uVar14) {
          local_35c = (char)lVar27;
          if (local_35c == '\0') {
            iVar12 = (this->super_Fl_RGB_Image).super_Fl_Image.h_;
            while (0 < iVar12) {
              iVar12 = iVar12 + -1;
              iVar16 = (this->super_Fl_RGB_Image).super_Fl_Image.w_;
              puVar21 = (this->super_Fl_RGB_Image).array +
                        (long)(iVar16 * iVar12) * (long)(this->super_Fl_RGB_Image).super_Fl_Image.d_
                        + 3;
              uVar14 = 0x80;
              for (; 0 < iVar16; iVar16 = iVar16 + -1) {
                if (uVar14 == 0x80) {
                  uVar20 = getc(__stream);
                }
                *puVar21 = -((uVar14 & uVar20 & 0xff) == 0);
                bVar33 = uVar14 < 2;
                uVar14 = uVar14 >> 1;
                if (bVar33) {
                  uVar14 = 0x80;
                }
                puVar21 = puVar21 + uVar13;
              }
              for (uVar29 = (long)((this->super_Fl_RGB_Image).super_Fl_Image.w_ + 7) / 8 &
                            0xffffffff; (uVar29 & 3) != 0; uVar29 = (ulong)((int)uVar29 + 1)) {
                getc(__stream);
              }
            }
          }
          fclose(__stream);
          return;
        }
        puVar21 = (this->super_Fl_RGB_Image).array;
        iVar12 = (this->super_Fl_RGB_Image).super_Fl_Image.w_;
        iVar16 = (this->super_Fl_RGB_Image).super_Fl_Image.d_;
        puVar30 = puVar21 + (int)(iVar12 * uVar15 * iVar16);
        if (uVar11 == 1) {
          uVar19 = 0x80;
          for (; 0 < iVar12; iVar12 = iVar12 + -1) {
            if (uVar19 == 0x80) {
              uVar20 = getc(__stream);
            }
            uVar28 = uVar6;
            uVar1 = uVar8;
            uVar2 = uVar7;
            if ((uVar19 & uVar20 & 0xff) == 0) {
              uVar28 = uVar3;
              uVar1 = uVar5;
              uVar2 = uVar4;
            }
            *puVar30 = uVar1;
            puVar30[1] = uVar2;
            puVar30[2] = uVar28;
            puVar30 = puVar30 + 3;
            bVar32 = uVar19 < 2;
            uVar19 = uVar19 >> 1;
            if (bVar32) {
              uVar19 = 0x80;
            }
          }
          uVar29 = (long)((this->super_Fl_RGB_Image).super_Fl_Image.w_ + 7) / 8;
          local_3a4 = (uint)uVar29;
          uVar19 = -local_3a4 & 3;
          for (uVar29 = uVar29 & 0xffffffff; (uVar29 & 3) != 0; uVar29 = (ulong)((int)uVar29 + 1)) {
            getc(__stream);
          }
LAB_00202bd3:
          local_3a4 = local_3a4 + uVar19;
        }
        else {
          if (uVar11 == 4) {
            cVar23 = -0x10;
            for (; 0 < iVar12; iVar12 = iVar12 + -1) {
              uVar19 = 2;
              if (uVar31 != 0) {
                uVar19 = uVar31;
              }
              if (uVar31 == 0 && local_388 == 2) {
                for (; 0 < (int)uVar24; uVar24 = uVar24 - 1) {
                  getc(__stream);
                }
                uVar19 = getc(__stream);
                uVar26 = getc(__stream);
                if (uVar19 != 0) {
                  uVar24 = 0;
                  goto LAB_00202914;
                }
                if (uVar26 != 0) {
                  if (uVar26 == 2) {
                    iVar16 = getc(__stream);
                    iVar17 = getc(__stream);
                    uVar31 = iVar17 * iVar16 * (this->super_Fl_RGB_Image).super_Fl_Image.w_ - 1;
                    uVar24 = 0;
                    uVar18 = 0;
                    uVar26 = 0;
                    uVar19 = 0;
                    if (cVar23 != -0x10) goto LAB_002029f1;
                    goto LAB_0020293c;
                  }
                  if (uVar26 != 1) {
                    uVar24 = -uVar26 >> 1 & 1;
                    uVar31 = uVar26 - 1;
                    uVar18 = 0xffffffff;
                    uVar19 = uVar18;
                    if (cVar23 == -0x10) goto LAB_00202928;
                    goto LAB_002029f1;
                  }
                  uVar24 = 0;
                  uVar31 = 1;
                  break;
                }
                iVar12 = iVar12 + 1;
                uVar24 = 0;
                uVar31 = 0;
              }
              else {
                uVar26 = -(uint)(uVar31 == 0) | uVar18;
LAB_00202914:
                uVar31 = uVar19 - 1;
                uVar19 = uVar26;
                if (cVar23 == -0x10) {
                  uVar18 = uVar26;
                  if ((int)uVar26 < 0) {
LAB_00202928:
                    uVar26 = getc(__stream);
                  }
LAB_0020293c:
                  uVar19 = uVar26 >> 4 & 0xf;
                  *puVar30 = colormap[uVar19][2];
                  puVar30[1] = colormap[uVar19][1];
                  puVar30[2] = colormap[uVar19][0];
                  cVar23 = '\x0f';
                  local_3a4 = uVar26;
                }
                else {
LAB_002029f1:
                  uVar18 = uVar19;
                  uVar19 = local_3a4 & 0xf;
                  *puVar30 = colormap[uVar19][2];
                  puVar30[1] = colormap[uVar19][1];
                  puVar30[2] = colormap[uVar19][0];
                  cVar23 = -0x10;
                }
                puVar30 = puVar30 + 3;
              }
            }
            if (local_388 != 0) goto LAB_00202bdf;
            uVar29 = (long)((this->super_Fl_RGB_Image).super_Fl_Image.w_ + 1) / 2;
            local_3a4 = (uint)uVar29;
            uVar19 = -local_3a4 & 3;
            for (uVar29 = uVar29 & 0xffffffff; (uVar29 & 3) != 0; uVar29 = (ulong)((int)uVar29 + 1))
            {
              getc(__stream);
            }
            goto LAB_00202bd3;
          }
          uVar19 = uVar18;
          if (uVar11 == 8) {
            while (uVar18 = uVar19, 0 < iVar12) {
              if (local_388 != 1) {
                uVar31 = 1;
                uVar18 = 0xffffffff;
              }
              if (uVar31 != 0) {
LAB_00202714:
                uVar19 = uVar18;
                if ((int)uVar18 < 0) goto LAB_00202730;
                goto LAB_0020273b;
              }
              for (; 0 < (int)uVar24; uVar24 = uVar24 - 1) {
                getc(__stream);
              }
              uVar19 = getc(__stream);
              uVar31 = getc(__stream);
              if (uVar19 != 0) {
                uVar24 = 0;
                uVar18 = uVar31;
                uVar31 = uVar19;
                goto LAB_00202714;
              }
              uVar24 = uVar31;
              uVar19 = uVar18;
              if (uVar31 != 0) {
                if (uVar31 == 1) {
                  uVar24 = 0;
                  break;
                }
                if (uVar31 == 2) {
                  iVar16 = getc(__stream);
                  iVar17 = getc(__stream);
                  uVar31 = iVar17 * iVar16 * (this->super_Fl_RGB_Image).super_Fl_Image.w_;
                  uVar24 = 0;
                  uVar18 = 0;
                  uVar19 = 0;
                }
                else {
                  uVar24 = uVar31 & 1;
                  uVar19 = 0xffffffff;
LAB_00202730:
                  uVar18 = getc(__stream);
                }
LAB_0020273b:
                uVar31 = uVar31 - 1;
                *puVar30 = colormap[(int)uVar18][2];
                puVar30[1] = colormap[(int)uVar18][1];
                puVar30[2] = colormap[(int)uVar18][0];
                puVar30 = puVar30 + (4 - lVar27);
                iVar12 = iVar12 + -1;
                local_3a4 = uVar18;
              }
            }
            if (local_388 == 0) {
              local_3a4 = (this->super_Fl_RGB_Image).super_Fl_Image.w_;
              uVar19 = -local_3a4 & 3;
              for (uVar26 = local_3a4; (uVar26 & 3) != 0; uVar26 = uVar26 + 1) {
                getc(__stream);
              }
              goto LAB_00202bd3;
            }
          }
          else {
            if (uVar11 == 0x10) {
              puVar21 = puVar21 + (long)(int)(iVar16 * iVar12 * uVar15) + 2;
              for (; 0 < iVar12; iVar12 = iVar12 + -1) {
                uVar19 = getc(__stream);
                iVar16 = getc(__stream);
                bVar9 = (byte)iVar16;
                if (bVar33) {
                  bVar22 = (byte)(uVar19 >> 2) & 0x38 | (byte)(iVar16 << 6);
                  bVar9 = bVar9 * '\x02';
                }
                else {
                  bVar22 = (byte)(uVar19 >> 3) & 0x1c | (byte)(iVar16 << 5);
                }
                *puVar21 = (char)uVar19 << 3;
                puVar21[-1] = bVar22;
                puVar21[-2] = bVar9 & 0xf8;
                puVar21 = puVar21 + uVar13;
              }
              local_3a4 = (this->super_Fl_RGB_Image).super_Fl_Image.w_ * 2;
              uVar19 = local_3a4 & 2;
              for (uVar26 = local_3a4; (uVar26 & 3) != 0; uVar26 = uVar26 + 1) {
                getc(__stream);
              }
              goto LAB_00202bd3;
            }
            if (uVar11 == 0x18) {
              puVar21 = puVar21 + (long)(int)(iVar16 * iVar12 * uVar15) + 2;
              for (; 0 < iVar12; iVar12 = iVar12 + -1) {
                iVar16 = getc(__stream);
                *puVar21 = (uchar)iVar16;
                iVar16 = getc(__stream);
                puVar21[-1] = (uchar)iVar16;
                iVar16 = getc(__stream);
                puVar21[-2] = (uchar)iVar16;
                puVar21 = puVar21 + uVar13;
              }
              uVar19 = (this->super_Fl_RGB_Image).super_Fl_Image.w_;
              local_3a4 = uVar19 * 3;
              for (uVar26 = local_3a4; (uVar26 & 3) != 0; uVar26 = uVar26 + 1) {
                getc(__stream);
              }
              local_3a4 = local_3a4 + (uVar19 & 3);
            }
            else if (uVar11 == 0x20) {
              puVar21 = puVar21 + (long)(int)(iVar16 * iVar12 * uVar15) + 3;
              for (; 0 < iVar12; iVar12 = iVar12 + -1) {
                iVar16 = getc(__stream);
                puVar21[-1] = (uchar)iVar16;
                iVar16 = getc(__stream);
                puVar21[-2] = (uchar)iVar16;
                iVar16 = getc(__stream);
                puVar21[-3] = (uchar)iVar16;
                iVar16 = getc(__stream);
                *puVar21 = (uchar)iVar16;
                puVar21 = puVar21 + uVar13;
              }
            }
          }
        }
LAB_00202bdf:
        uVar15 = uVar15 + local_360;
      } while( true );
    }
    (*Fl::warning)("BMP file \"%s\" is too large!\n",bmp);
  }
  fclose(__stream);
  (this->super_Fl_RGB_Image).super_Fl_Image.w_ = 0;
  (this->super_Fl_RGB_Image).super_Fl_Image.h_ = 0;
  (this->super_Fl_RGB_Image).super_Fl_Image.d_ = 0;
  (this->super_Fl_RGB_Image).super_Fl_Image.ld_ = -3;
  return;
}

Assistant:

Fl_BMP_Image::Fl_BMP_Image(const char *bmp) // I - File to read
  : Fl_RGB_Image(0,0,0) {
  FILE		*fp;		// File pointer
  int		info_size,	// Size of info header
		depth,		// Depth of image (bits)
		bDepth = 3,	// Depth of image (bytes)
		compression,	// Type of compression
		colors_used,	// Number of colors used
		x, y,		// Looping vars
		color,		// Color of RLE pixel
		repcount,	// Number of times to repeat
		temp,		// Temporary color
		align,		// Alignment bytes
		dataSize,	// number of bytes in image data set
		row_order,	// 1 = normal;  -1 = flipped row order
		start_y,	// Beginning Y
		end_y;		// Ending Y
  long		offbits;	// Offset to image data
  uchar		bit,		// Bit in image
		byte;		// Byte in image
  uchar		*ptr;		// Pointer into pixels
  uchar		colormap[256][3];// Colormap
  uchar		havemask;	// Single bit mask follows image data
  int		use_5_6_5;	// Use 5:6:5 for R:G:B channels in 16 bit images


  // Open the file...
  if ((fp = fl_fopen(bmp, "rb")) == NULL) {
    ld(ERR_FILE_ACCESS);
    return;
  }

  // Get the header...
  byte = (uchar)getc(fp);	// Check "BM" sync chars
  bit  = (uchar)getc(fp);
  if (byte != 'B' || bit != 'M') {
    fclose(fp);
    ld(ERR_FORMAT);
    return;
  }

  read_dword(fp);		// Skip size
  read_word(fp);		// Skip reserved stuff
  read_word(fp);
  offbits = (long)read_dword(fp);// Read offset to image data

  // Then the bitmap information...
  info_size = read_dword(fp);

//  printf("offbits = %ld, info_size = %d\n", offbits, info_size);

  havemask  = 0;
  row_order = -1;
  use_5_6_5 = 0;

  if (info_size < 40) {
    // Old Windows/OS2 BMP header...
    w(read_word(fp));
    h(read_word(fp));
    read_word(fp);
    depth = read_word(fp);
    compression = BI_RGB;
    colors_used = 0;

    repcount = info_size - 12;
  } else {
    // New BMP header...
    w(read_long(fp));
    // If the height is negative, the row order is flipped
    temp = read_long(fp);
    if (temp < 0) row_order = 1;
    h(abs(temp));
    read_word(fp);
    depth = read_word(fp);
    compression = read_dword(fp);
    dataSize = read_dword(fp);
    read_long(fp);
    read_long(fp);
    colors_used = read_dword(fp);
    read_dword(fp);

    repcount = info_size - 40;

    if (!compression && depth>=8 && w()>32/depth) {
      int Bpp = depth/8;
      int maskSize = (((w()*Bpp+3)&~3)*h()) + (((((w()+7)/8)+3)&~3)*h());
      if (maskSize==2*dataSize) {
        havemask = 1;
	h(h()/2);
	bDepth = 4;
      }
    }
  }

//  printf("w() = %d, h() = %d, depth = %d, compression = %d, colors_used = %d, repcount = %d\n",
//         w(), h(), depth, compression, colors_used, repcount);

  // Skip remaining header bytes...
  while (repcount > 0) {
    getc(fp);
    repcount --;
  }

  // Check header data...
  if (!w() || !h() || !depth) {
    fclose(fp);
    w(0); h(0); d(0); ld(ERR_FORMAT);
    return;
  }

  // Get colormap...
  if (colors_used == 0 && depth <= 8)
    colors_used = 1 << depth;

  for (repcount = 0; repcount < colors_used; repcount ++) {
    // Read BGR color...
    if (fread(colormap[repcount], 1, 3, fp)==0) { /* ignore */ }

    // Skip pad byte for new BMP files...
    if (info_size > 12) getc(fp);
  }

  // Read first dword of colormap. It tells us if 5:5:5 or 5:6:5 for 16 bit
  if (depth == 16)
    use_5_6_5 = (read_dword(fp) == 0xf800);

  // Set byte depth for RGBA images
  if (depth == 32)
    bDepth=4;

  // Setup image and buffers...
  d(bDepth);
  if (offbits) fseek(fp, offbits, SEEK_SET);

  if (((size_t)w()) * h() * d() > max_size() ) {
    Fl::warning("BMP file \"%s\" is too large!\n", bmp);
    fclose(fp);
    w(0); h(0); d(0); ld(ERR_FORMAT);
    return;
  }
  array = new uchar[w() * h() * d()];
  alloc_array = 1;

  // Read the image data...
  color = 0;
  repcount = 0;
  align = 0;
  byte  = 0;
  temp  = 0;

  if (row_order < 0) {
    start_y = h() - 1;
    end_y   = -1;
  } else {
    start_y = 0;
    end_y   = h();
  }

  for (y = start_y; y != end_y; y += row_order) {
    ptr = (uchar *)array + y * w() * d();

    switch (depth)
    {
      case 1 : // Bitmap
          for (x = w(), bit = 128; x > 0; x --) {
	    if (bit == 128) byte = (uchar)getc(fp);

	    if (byte & bit) {
	      *ptr++ = colormap[1][2];
	      *ptr++ = colormap[1][1];
	      *ptr++ = colormap[1][0];
	    } else {
	      *ptr++ = colormap[0][2];
	      *ptr++ = colormap[0][1];
	      *ptr++ = colormap[0][0];
	    }

	    if (bit > 1)
	      bit >>= 1;
	    else
	      bit = 128;
	  }

          // Read remaining bytes to align to 32 bits...
	  for (temp = (w() + 7) / 8; temp & 3; temp ++) {
	    getc(fp);
	  }
          break;

      case 4 : // 16-color
          for (x = w(), bit = 0xf0; x > 0; x --) {
	    // Get a new repcount as needed...
	    if (repcount == 0) {
              if (compression != BI_RLE4) {
		repcount = 2;
		color = -1;
              } else {
		while (align > 0) {
	          align --;
		  getc(fp);
        	}

		if ((repcount = getc(fp)) == 0) {
		  if ((repcount = getc(fp)) == 0) {
		    // End of line...
                    x ++;
		    continue;
		  } else if (repcount == 1) {
                    // End of image...
		    break;
		  } else if (repcount == 2) {
		    // Delta...
		    repcount = getc(fp) * getc(fp) * w();
		    color = 0;
		  } else {
		    // Absolute...
		    color = -1;
		    align = ((4 - (repcount & 3)) / 2) & 1;
		  }
		} else {
	          color = getc(fp);
		}
	      }
	    }

            // Get a new color as needed...
	    repcount --;

	    // Extract the next pixel...
            if (bit == 0xf0) {
	      // Get the next color byte as needed...
              if (color < 0) temp = getc(fp);
	      else temp = color;

              // Copy the color value...
	      *ptr++ = colormap[(temp >> 4) & 15][2];
	      *ptr++ = colormap[(temp >> 4) & 15][1];
	      *ptr++ = colormap[(temp >> 4) & 15][0];

	      bit  = 0x0f;
	    } else {
	      bit  = 0xf0;

              // Copy the color value...
	      *ptr++ = colormap[temp & 15][2];
	      *ptr++ = colormap[temp & 15][1];
	      *ptr++ = colormap[temp & 15][0];
	    }

	  }

	  if (!compression) {
            // Read remaining bytes to align to 32 bits...
	    for (temp = (w() + 1) / 2; temp & 3; temp ++) {
	      getc(fp);
	    }
	  }
          break;

      case 8 : // 256-color
          for (x = w(); x > 0; x --) {
	    // Get a new repcount as needed...
            if (compression != BI_RLE8) {
	      repcount = 1;
	      color = -1;
            }

	    if (repcount == 0) {
	      while (align > 0) {
	        align --;
		getc(fp);
              }

	      if ((repcount = getc(fp)) == 0) {
		if ((repcount = getc(fp)) == 0) {
		  // End of line...
                  x ++;
		  continue;
		} else if (repcount == 1) {
		  // End of image...
		  break;
		} else if (repcount == 2) {
		  // Delta...
		  repcount = getc(fp) * getc(fp) * w();
		  color = 0;
		} else {
		  // Absolute...
		  color = -1;
		  align = (2 - (repcount & 1)) & 1;
		}
	      } else {
	        color = getc(fp);
              }
            }

            // Get a new color as needed...
            if (color < 0) temp = getc(fp);
	    else temp = color;

            repcount --;

            // Copy the color value...
	    *ptr++ = colormap[temp][2];
	    *ptr++ = colormap[temp][1];
	    *ptr++ = colormap[temp][0];
	    if (havemask) ptr++;
	  }

	  if (!compression) {
            // Read remaining bytes to align to 32 bits...
	    for (temp = w(); temp & 3; temp ++) {
	      getc(fp);
	    }
	  }
          break;

      case 16 : // 16-bit 5:5:5 or 5:6:5 RGB
          for (x = w(); x > 0; x --, ptr += bDepth) {
	    uchar b = getc(fp), a = getc(fp) ;
	    if (use_5_6_5) {
		ptr[2] = (uchar)(( b << 3 ) & 0xf8);
		ptr[1] = (uchar)(((a << 5) & 0xe0) | ((b >> 3) & 0x1c));
		ptr[0] = (uchar)(a & 0xf8);
	    } else {
		ptr[2] = (uchar)((b << 3) & 0xf8);
		ptr[1] = (uchar)(((a << 6) & 0xc0) | ((b >> 2) & 0x38));
		ptr[0] = (uchar)((a<<1) & 0xf8);
	    }
	  }

          // Read remaining bytes to align to 32 bits...
	  for (temp = w() * 2; temp & 3; temp ++) {
	    getc(fp);
	  }
          break;

      case 24 : // 24-bit RGB
          for (x = w(); x > 0; x --, ptr += bDepth) {
	    ptr[2] = (uchar)getc(fp);
	    ptr[1] = (uchar)getc(fp);
	    ptr[0] = (uchar)getc(fp);
	  }

          // Read remaining bytes to align to 32 bits...
	  for (temp = w() * 3; temp & 3; temp ++) {
	    getc(fp);
	  }
          break;
		  
      case 32 : // 32-bit RGBA
         for (x = w(); x > 0; x --, ptr += bDepth) {
            ptr[2] = (uchar)getc(fp);
            ptr[1] = (uchar)getc(fp);
            ptr[0] = (uchar)getc(fp);
            ptr[3] = (uchar)getc(fp);
          }
          break;
    }
  }
  
  if (havemask) {
    for (y = h() - 1; y >= 0; y --) {
      ptr = (uchar *)array + y * w() * d() + 3;
      for (x = w(), bit = 128; x > 0; x --, ptr+=bDepth) {
	if (bit == 128) byte = (uchar)getc(fp);
	if (byte & bit)
	  *ptr = 0;
	else
	  *ptr = 255;
	if (bit > 1)
	  bit >>= 1;
	else
	  bit = 128;
      }
      // Read remaining bytes to align to 32 bits...
      for (temp = (w() + 7) / 8; temp & 3; temp ++)
	getc(fp);
    }
  }

  // Close the file and return...
  fclose(fp);
}